

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_submit.c
# Opt level: O0

int nghttp2_submit_altsvc
              (nghttp2_session *session,uint8_t flags,int32_t stream_id,uint8_t *origin,
              size_t origin_len,uint8_t *field_value,size_t field_value_len)

{
  nghttp2_mem *mem_00;
  uint8_t *dest;
  nghttp2_outbound_item *item_00;
  uint8_t *dest_00;
  int rv;
  nghttp2_ext_altsvc *altsvc;
  nghttp2_frame *frame;
  nghttp2_outbound_item *item;
  uint8_t *field_value_copy;
  uint8_t *origin_copy;
  uint8_t *p;
  uint8_t *buf;
  nghttp2_mem *mem;
  uint8_t *field_value_local;
  size_t origin_len_local;
  uint8_t *origin_local;
  int32_t stream_id_local;
  uint8_t flags_local;
  nghttp2_session *session_local;
  
  mem_00 = &session->mem;
  if (session->server == '\0') {
    session_local._4_4_ = -0x207;
  }
  else if (origin_len + 2 + field_value_len < 0x4001) {
    if (stream_id == 0) {
      if (origin_len == 0) {
        return -0x1f5;
      }
    }
    else if (origin_len != 0) {
      return -0x1f5;
    }
    dest = (uint8_t *)nghttp2_mem_malloc(mem_00,origin_len + field_value_len + 2);
    if (dest == (uint8_t *)0x0) {
      session_local._4_4_ = -0x385;
    }
    else {
      origin_copy = dest;
      if (origin_len != 0) {
        origin_copy = nghttp2_cpymem(dest,origin,origin_len);
      }
      dest_00 = origin_copy + 1;
      *origin_copy = '\0';
      origin_copy = dest_00;
      if (field_value_len != 0) {
        origin_copy = nghttp2_cpymem(dest_00,field_value,field_value_len);
      }
      *origin_copy = '\0';
      item_00 = (nghttp2_outbound_item *)nghttp2_mem_malloc(mem_00,0x98);
      if (item_00 == (nghttp2_outbound_item *)0x0) {
        free(dest);
        session_local._4_4_ = -0x385;
      }
      else {
        nghttp2_outbound_item_init(item_00);
        (item_00->aux_data).goaway.flags = '\x01';
        (item_00->frame).ext.payload = &item_00->ext_frame_payload;
        nghttp2_frame_altsvc_init
                  ((nghttp2_extension *)item_00,stream_id,dest,origin_len,dest_00,field_value_len);
        session_local._4_4_ = nghttp2_session_add_item(session,item_00);
        if (session_local._4_4_ == 0) {
          session_local._4_4_ = 0;
        }
        else {
          nghttp2_frame_altsvc_free((nghttp2_extension *)item_00,mem_00);
          nghttp2_mem_free(mem_00,item_00);
        }
      }
    }
  }
  else {
    session_local._4_4_ = -0x1f5;
  }
  return session_local._4_4_;
}

Assistant:

int nghttp2_submit_altsvc(nghttp2_session *session, uint8_t flags,
                          int32_t stream_id, const uint8_t *origin,
                          size_t origin_len, const uint8_t *field_value,
                          size_t field_value_len) {
  nghttp2_mem *mem;
  uint8_t *buf, *p;
  uint8_t *origin_copy;
  uint8_t *field_value_copy;
  nghttp2_outbound_item *item;
  nghttp2_frame *frame;
  nghttp2_ext_altsvc *altsvc;
  int rv;
  (void)flags;

  mem = &session->mem;

  if (!session->server) {
    return NGHTTP2_ERR_INVALID_STATE;
  }

  if (2 + origin_len + field_value_len > NGHTTP2_MAX_PAYLOADLEN) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  if (stream_id == 0) {
    if (origin_len == 0) {
      return NGHTTP2_ERR_INVALID_ARGUMENT;
    }
  } else if (origin_len != 0) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  buf = nghttp2_mem_malloc(mem, origin_len + field_value_len + 2);
  if (buf == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  p = buf;

  origin_copy = p;
  if (origin_len) {
    p = nghttp2_cpymem(p, origin, origin_len);
  }
  *p++ = '\0';

  field_value_copy = p;
  if (field_value_len) {
    p = nghttp2_cpymem(p, field_value, field_value_len);
  }
  *p++ = '\0';

  item = nghttp2_mem_malloc(mem, sizeof(nghttp2_outbound_item));
  if (item == NULL) {
    rv = NGHTTP2_ERR_NOMEM;
    goto fail_item_malloc;
  }

  nghttp2_outbound_item_init(item);

  item->aux_data.ext.builtin = 1;

  altsvc = &item->ext_frame_payload.altsvc;

  frame = &item->frame;
  frame->ext.payload = altsvc;

  nghttp2_frame_altsvc_init(&frame->ext, stream_id, origin_copy, origin_len,
                            field_value_copy, field_value_len);

  rv = nghttp2_session_add_item(session, item);
  if (rv != 0) {
    nghttp2_frame_altsvc_free(&frame->ext, mem);
    nghttp2_mem_free(mem, item);

    return rv;
  }

  return 0;

fail_item_malloc:
  free(buf);

  return rv;
}